

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

ostream * tcb::operator<<(ostream *os,rational<char> *r)

{
  ostream *poVar1;
  
  std::operator<<(os,r->num_);
  if (r->denom_ != '\x01') {
    poVar1 = std::operator<<(os,'/');
    std::operator<<(poVar1,r->denom_);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}